

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_glow.cpp
# Opt level: O1

int gl_CheckSpriteGlow(sector_t *sec,int lightlevel,DVector3 *pos)

{
  uint uVar1;
  int iVar2;
  FTexture *pFVar3;
  double dVar4;
  double dVar5;
  
  uVar1 = sec->planes[0].Texture.texnum;
  if (uVar1 < TexMan.Textures.Count) {
    pFVar3 = TexMan.Textures.Array[(int)uVar1].Texture;
  }
  else {
    pFVar3 = (FTexture *)0x0;
  }
  if (((pFVar3 != (FTexture *)0x0) && (((pFVar3->gl_info).field_0x4c & 4) != 0)) &&
     (iVar2 = (pFVar3->gl_info).GlowHeight, iVar2 != 0)) {
    dVar4 = pos->Z - ((sec->floorplane).normal.Y * pos->Y +
                     (sec->floorplane).normal.X * pos->X + (sec->floorplane).D) *
                     (sec->floorplane).negiC;
    dVar5 = (double)iVar2;
    if (dVar4 < dVar5) {
      dVar4 = dVar4 / dVar5;
      dVar5 = 0.0;
      if (0.0 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar4 = (double)(lightlevel + 0xff >> 1);
      lightlevel = (int)(((double)lightlevel - dVar4) * dVar5 + dVar4);
    }
  }
  return lightlevel;
}

Assistant:

int gl_CheckSpriteGlow(sector_t *sec, int lightlevel, const DVector3 &pos)
{
	FTextureID floorpic = sec->GetTexture(sector_t::floor);
	FTexture *tex = TexMan[floorpic];
	if (tex != NULL && tex->isGlowing())
	{
		double floordiff = pos.Z - sec->floorplane.ZatPoint(pos);
		if (floordiff < tex->gl_info.GlowHeight && tex->gl_info.GlowHeight != 0)
		{
			int maxlight = (255 + lightlevel) >> 1;
			double lightfrac = floordiff / tex->gl_info.GlowHeight;
			if (lightfrac < 0) lightfrac = 0;
			lightlevel = int(lightfrac*lightlevel + maxlight*(1 - lightfrac));
		}
	}
	return lightlevel;
}